

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Buffers::DataTest::LogFail
          (DataTest *this,offset_in_DataTest_to_subr UploadDataFunction,GLenum parameter,
          GLuint *data,GLuint *reference,GLsizei count)

{
  ostringstream *this_00;
  undefined4 in_register_00000014;
  long lVar1;
  undefined4 in_register_0000008c;
  ulong uVar2;
  GLsizei i;
  ulong uVar3;
  string the_log;
  stringstream bitfield_string_stream;
  string asStack_228 [32];
  Bitfield<16UL> local_208;
  DataTest *local_1e8;
  undefined8 local_1e0;
  GLuint *local_1d8;
  Bitfield<16UL> local_1d0;
  undefined1 local_1b8 [16];
  ostream local_1a8;
  
  lVar1 = CONCAT44(in_register_00000014,parameter);
  local_1e0 = CONCAT44(in_register_0000008c,count);
  local_1e8 = this;
  local_1d8 = reference;
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_228,"The test of ",(allocator<char> *)local_1b8);
  if ((((code *)UploadDataFunction == UploadUsingNamedBufferData && lVar1 == 0) ||
      ((code *)UploadDataFunction == UploadUsingNamedBufferSubData && lVar1 == 0)) ||
     ((code *)UploadDataFunction != UploadUsingNamedBufferStorage || lVar1 != 0)) {
    std::__cxx11::string::append((char *)asStack_228);
    std::__cxx11::string::append((char *)asStack_228);
    glu::getUsageName((int)data);
    std::__cxx11::string::append((char *)asStack_228);
  }
  else {
    std::__cxx11::string::append((char *)asStack_228);
    std::__cxx11::string::append((char *)asStack_228);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    glu::getBufferMapFlagsStr(&local_1d0,(int)data);
    local_208.m_end = local_1d0.m_end;
    local_208.m_value = local_1d0.m_value;
    local_208.m_begin = local_1d0.m_begin;
    tcu::Format::Bitfield<16UL>::toStream(&local_208,&local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append(asStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  std::__cxx11::string::append((char *)asStack_228);
  uVar2 = 0;
  uVar3 = (ulong)(uint)the_log._M_string_length;
  if ((int)(uint)the_log._M_string_length < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append(asStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    if ((uint)the_log._M_string_length - 1 != uVar2) {
      std::__cxx11::string::append((char *)asStack_228);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  std::__cxx11::string::append((char *)asStack_228);
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append(asStack_228);
    std::__cxx11::string::~string((string *)&local_208);
    if ((uint)the_log._M_string_length - 1 != uVar2) {
      std::__cxx11::string::append((char *)asStack_228);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  std::__cxx11::string::append((char *)asStack_228);
  local_1b8._0_8_ = ((local_1e8->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,asStack_228);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::string::~string(asStack_228);
  return;
}

Assistant:

void DataTest::LogFail(void (DataTest::*UploadDataFunction)(glw::GLuint, glw::GLenum), glw::GLenum parameter,
					   const glw::GLuint* data, const glw::GLuint* reference, const glw::GLsizei count)
{
	std::string the_log = "The test of ";

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferData)
	{
		the_log.append("glNamedBufferData");
	}
	else
	{
		if (UploadDataFunction == &DataTest::UploadUsingNamedBufferSubData)
		{
			the_log.append("glNamedBufferSubData");
		}
		else
		{
			if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
			{
				the_log.append("glNamedBufferStorage");
			}
			else
			{
				if (UploadDataFunction == &DataTest::UploadUsingCopyNamedBufferSubData)
				{
					the_log.append("glCopyNamedBufferSubData");
				}
				else
				{
					the_log.append("uknown upload function");
				}
			}
		}
	}

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
	{
		the_log.append(" called with usage parameter ");

		std::stringstream bitfield_string_stream;
		bitfield_string_stream << glu::getBufferMapFlagsStr(parameter);
		the_log.append(bitfield_string_stream.str());
	}
	else
	{
		the_log.append(" called with usage parameter ");
		the_log.append(glu::getUsageName(parameter));
	}
	the_log.append(". Buffer data is equal to [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << data[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("], but [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << reference[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("] was expected.");

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}